

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VM.cpp
# Opt level: O0

pair<const_char_*,_int> __thiscall luna::VM::GetCurrentInstructionPos(VM *this)

{
  Instruction *pIVar1;
  bool bVar2;
  Instruction *pIVar3;
  String *this_00;
  long *in_RDI;
  pair<const_char_*,_int> pVar4;
  long index;
  Function *proto;
  value_type *call;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar5;
  int local_3c;
  char *local_38;
  long local_30;
  Function *local_28;
  reference local_20;
  undefined1 local_10 [12];
  
  bVar2 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::empty
                    ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)(*in_RDI + 0x48));
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("!state_->calls_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                  0x22e,"std::pair<const char *, int> luna::VM::GetCurrentInstructionPos() const");
  }
  local_20 = std::__cxx11::list<luna::CallInfo,_std::allocator<luna::CallInfo>_>::back
                       ((list<luna::CallInfo,_std::allocator<luna::CallInfo>_> *)
                        CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  uVar5 = false;
  if (local_20->func_ != (Value *)0x0) {
    uVar5 = (local_20->func_->field_0).obj_ != (GCObject *)0x0;
  }
  if ((bool)uVar5 == false) {
    __assert_fail("call->func_ && call->func_->closure_",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/VM.cpp",
                  0x22e,"std::pair<const char *, int> luna::VM::GetCurrentInstructionPos() const");
  }
  local_28 = Closure::GetPrototype((local_20->func_->field_0).closure_);
  pIVar1 = local_20->instruction_;
  pIVar3 = Function::GetOpCodes((Function *)CONCAT17(uVar5,in_stack_ffffffffffffffb0));
  local_30 = (long)pIVar1 + (-4 - (long)pIVar3) >> 2;
  this_00 = Function::GetModule(local_28);
  local_38 = String::GetCStr(this_00);
  local_3c = Function::GetInstructionLine
                       ((Function *)CONCAT17(uVar5,in_stack_ffffffffffffffb0),
                        (int)((ulong)pIVar1 >> 0x20));
  std::pair<const_char_*,_int>::pair<const_char_*,_int,_true>
            ((pair<const_char_*,_int> *)local_10,&local_38,&local_3c);
  pVar4._12_4_ = 0;
  pVar4.first = (char *)local_10._0_8_;
  pVar4.second = local_10._8_4_;
  return pVar4;
}

Assistant:

std::pair<const char *, int> VM::GetCurrentInstructionPos() const
    {
        GET_CALLINFO_AND_PROTO();
        auto index = call->instruction_ - 1 - proto->GetOpCodes();
        return { proto->GetModule()->GetCStr(),
                 proto->GetInstructionLine(index) };
    }